

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O2

int coda__pcre2_auto_possessify_8(PCRE2_UCHAR8 *code,compile_block_8 *cb)

{
  PCRE2_UCHAR8 PVar1;
  BOOL BVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint8_t *in_RCX;
  byte bVar6;
  byte bVar7;
  uint32_t *in_R8;
  uint utf;
  int *in_stack_ffffffffffffff98;
  int rec_limit;
  uint32_t list [8];
  ulong uVar5;
  
  rec_limit = 1000;
  utf = cb->external_options >> 0x13 & 1;
  do {
    bVar6 = *code;
    if (0xaa < bVar6) {
      return -1;
    }
    BVar2 = (BOOL)(compile_block_8 *)list;
    if ((byte)(bVar6 - 0x21) < 0x41) {
      PVar1 = get_repeat_base(bVar6);
      bVar6 = bVar6 - PVar1;
      bVar7 = bVar6 + 0x21;
      if (bVar7 < 0x29) {
        puVar3 = (uint32_t *)get_chr_property_list(code,(BOOL)cb->fcc,BVar2,in_RCX,in_R8);
      }
      else {
        puVar3 = (uint32_t *)0x0;
      }
      if ((0x25 < bVar7) || (list[1] = 1, (0x2a00000000U >> ((ulong)bVar7 & 0x3f) & 1) == 0)) {
        list[1] = (uint32_t)(bVar7 == 0x27);
      }
      if (((puVar3 != (uint32_t *)0x0) &&
          (BVar2 = compare_opcodes((PCRE2_SPTR8)puVar3,utf,(BOOL)cb,(compile_block_8 *)list,puVar3,
                                   (PCRE2_SPTR8)&rec_limit,in_stack_ffffffffffffff98),
          in_R8 = puVar3, BVar2 != 0)) && (bVar6 < 8)) {
        *code = *code + (char)(0x506060707080809 >> ((bVar6 & 7) << 3));
      }
LAB_00177034:
      bVar6 = *code;
    }
    else if ((byte)(bVar6 + 0x92) < 3) {
      bVar6 = code[0x21];
      if ((byte)(bVar6 + 0x9e) < 8) {
        puVar3 = (uint32_t *)get_chr_property_list(code,(BOOL)cb->fcc,BVar2,in_RCX,in_R8);
        list[1] = ~(uint)bVar6 & 1;
        if ((puVar3 != (uint32_t *)0x0) &&
           (BVar2 = compare_opcodes((PCRE2_SPTR8)puVar3,utf,(BOOL)cb,(compile_block_8 *)list,puVar3,
                                    (PCRE2_SPTR8)&rec_limit,in_stack_ffffffffffffff98),
           in_R8 = puVar3, BVar2 != 0)) {
          code[0x21] = (byte)(0x6d6d6c6c6b6b6a6a >> ((bVar6 + 0x9e & 7) << 3));
        }
      }
      goto LAB_00177034;
    }
    uVar4 = bVar6 - 0x55;
    uVar5 = (ulong)uVar4;
    if (uVar4 < 0x23) {
      if ((0xe3fUL >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x11c0UL >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 != 0x22) goto LAB_00177088;
          in_RCX = (uint8_t *)
                   (ulong)(ushort)(*(ushort *)(code + 5) << 8 | *(ushort *)(code + 5) >> 8);
          goto LAB_001770a2;
        }
        bVar7 = code[3];
      }
      else {
        bVar7 = code[1];
      }
      in_RCX = (uint8_t *)(ulong)CONCAT31((int3)(uVar4 >> 8),bVar7 - 0xf);
      code = code + (ulong)((byte)(bVar7 - 0xf) < 2) * 2;
    }
    else {
LAB_00177088:
      uVar4 = bVar6 - 0x9a;
      in_RCX = (uint8_t *)(ulong)uVar4;
      if ((uVar4 < 9) && ((0x155U >> (uVar4 & 0x1f) & 1) != 0)) {
        in_RCX = (uint8_t *)(ulong)code[1];
LAB_001770a2:
        code = code + (long)in_RCX;
      }
      else if (bVar6 == 0) {
        return (uint)bVar6;
      }
    }
    code = code + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                  [bVar6];
  } while( true );
}

Assistant:

int
PRIV(auto_possessify)(PCRE2_UCHAR *code, const compile_block *cb)
{
PCRE2_UCHAR c;
PCRE2_SPTR end;
PCRE2_UCHAR *repeat_opcode;
uint32_t list[8];
int rec_limit = 1000;  /* Was 10,000 but clang+ASAN uses a lot of stack. */
BOOL utf = (cb->external_options & PCRE2_UTF) != 0;
BOOL ucp = (cb->external_options & PCRE2_UCP) != 0;

for (;;)
  {
  c = *code;

  if (c >= OP_TABLE_LENGTH) return -1;   /* Something gone wrong */

  if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
    {
    c -= get_repeat_base(c) - OP_STAR;
    end = (c <= OP_MINUPTO) ?
      get_chr_property_list(code, utf, ucp, cb->fcc, list) : NULL;
    list[1] = c == OP_STAR || c == OP_PLUS || c == OP_QUERY || c == OP_UPTO;

    if (end != NULL && compare_opcodes(end, utf, ucp, cb, list, end,
        &rec_limit))
      {
      switch(c)
        {
        case OP_STAR:
        *code += OP_POSSTAR - OP_STAR;
        break;

        case OP_MINSTAR:
        *code += OP_POSSTAR - OP_MINSTAR;
        break;

        case OP_PLUS:
        *code += OP_POSPLUS - OP_PLUS;
        break;

        case OP_MINPLUS:
        *code += OP_POSPLUS - OP_MINPLUS;
        break;

        case OP_QUERY:
        *code += OP_POSQUERY - OP_QUERY;
        break;

        case OP_MINQUERY:
        *code += OP_POSQUERY - OP_MINQUERY;
        break;

        case OP_UPTO:
        *code += OP_POSUPTO - OP_UPTO;
        break;

        case OP_MINUPTO:
        *code += OP_POSUPTO - OP_MINUPTO;
        break;
        }
      }
    c = *code;
    }
  else if (c == OP_CLASS || c == OP_NCLASS || c == OP_XCLASS)
    {
#ifdef SUPPORT_WIDE_CHARS
    if (c == OP_XCLASS)
      repeat_opcode = code + GET(code, 1);
    else
#endif
      repeat_opcode = code + 1 + (32 / sizeof(PCRE2_UCHAR));

    c = *repeat_opcode;
    if (c >= OP_CRSTAR && c <= OP_CRMINRANGE)
      {
      /* The return from get_chr_property_list() will never be NULL when
      *code (aka c) is one of the three class opcodes. However, gcc with
      -fanalyzer notes that a NULL return is possible, and grumbles. Hence we
      put in a check. */

      end = get_chr_property_list(code, utf, ucp, cb->fcc, list);
      list[1] = (c & 1) == 0;

      if (end != NULL &&
          compare_opcodes(end, utf, ucp, cb, list, end, &rec_limit))
        {
        switch (c)
          {
          case OP_CRSTAR:
          case OP_CRMINSTAR:
          *repeat_opcode = OP_CRPOSSTAR;
          break;

          case OP_CRPLUS:
          case OP_CRMINPLUS:
          *repeat_opcode = OP_CRPOSPLUS;
          break;

          case OP_CRQUERY:
          case OP_CRMINQUERY:
          *repeat_opcode = OP_CRPOSQUERY;
          break;

          case OP_CRRANGE:
          case OP_CRMINRANGE:
          *repeat_opcode = OP_CRPOSRANGE;
          break;
          }
        }
      }
    c = *code;
    }

  switch(c)
    {
    case OP_END:
    return 0;

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    if (code[1] == OP_PROP || code[1] == OP_NOTPROP) code += 2;
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSUPTO:
    if (code[1 + IMM2_SIZE] == OP_PROP || code[1 + IMM2_SIZE] == OP_NOTPROP)
      code += 2;
    break;

    case OP_CALLOUT_STR:
    code += GET(code, 1 + 2*LINK_SIZE);
    break;

#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    code += GET(code, 1);
    break;
#endif

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    code += code[1];
    break;
    }

  /* Add in the fixed length from the table */

  code += PRIV(OP_lengths)[c];

  /* In UTF-8 and UTF-16 modes, opcodes that are followed by a character may be
  followed by a multi-byte character. The length in the table is a minimum, so
  we have to arrange to skip the extra code units. */

#ifdef MAYBE_UTF_MULTI
  if (utf) switch(c)
    {
    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    if (HAS_EXTRALEN(code[-1])) code += GET_EXTRALEN(code[-1]);
    break;
    }
#else
  (void)(utf);  /* Keep compiler happy by referencing function argument */
#endif  /* SUPPORT_WIDE_CHARS */
  }
}